

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# texturetests.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_c633::ktxTexture1_CreateTest_CreateEmptySetImagesWriteToMemory_Test::TestBody
          (ktxTexture1_CreateTest_CreateEmptySetImagesWriteToMemory_Test *this)

{
  bool bVar1;
  undefined8 uVar2;
  char *lhs_expression;
  size_t sVar3;
  TextureWriterTestHelper<unsigned_char,_4U,_32856U> *in_RDI;
  AssertionResult gtest_ar_4;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar__1;
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar;
  char orientation [10];
  ktx_size_t testMemFileLen;
  ktx_uint8_t *testMemFile;
  ktx_error_code_e result;
  ktxTexture1 *texture;
  char (*in_stack_fffffffffffffe08) [28];
  AssertionResult *in_stack_fffffffffffffe10;
  bool *in_stack_fffffffffffffe18;
  char *in_stack_fffffffffffffe20;
  char *in_stack_fffffffffffffe28;
  int iVar4;
  Message *in_stack_fffffffffffffe30;
  undefined8 in_stack_fffffffffffffe38;
  Type type;
  AssertHelper *in_stack_fffffffffffffe40;
  ktxTexture1 *in_stack_fffffffffffffe48;
  char *in_stack_fffffffffffffe70;
  _Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  in_stack_fffffffffffffe78;
  ktx_uint8_t *in_stack_fffffffffffffe80;
  TextureWriterTestHelper<unsigned_char,_4U,_32856U> *in_stack_fffffffffffffe88;
  AssertHelper *in_stack_fffffffffffffe90;
  AssertionResult local_148 [2];
  undefined1 local_122;
  undefined1 local_121;
  AssertionResult local_120;
  string local_110 [55];
  undefined1 local_d9;
  AssertionResult local_d8;
  uint local_c4;
  string local_c0 [40];
  undefined8 local_98;
  undefined1 local_81;
  AssertionResult local_80 [3];
  undefined4 local_4c;
  AssertionResult local_48;
  char local_32 [10];
  undefined1 local_28 [8];
  void *local_20;
  ktx_error_code_e local_14;
  long local_10 [2];
  
  type = (Type)((ulong)in_stack_fffffffffffffe38 >> 0x20);
  local_10[0] = 0;
  local_14 = ktxTexture1_Create(*(undefined8 *)
                                 &in_RDI[1].super_WriterTestHelper<unsigned_char,_4U,_32856U>.
                                  isArray,1,local_10);
  local_4c = 0;
  testing::internal::EqHelper::Compare<ktx_error_code_e,_ktx_error_code_e,_nullptr>
            (in_stack_fffffffffffffe28,in_stack_fffffffffffffe20,
             (ktx_error_code_e *)in_stack_fffffffffffffe18,
             (ktx_error_code_e *)in_stack_fffffffffffffe10);
  iVar4 = (int)((ulong)in_stack_fffffffffffffe28 >> 0x20);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_48);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffe40);
    in_stack_fffffffffffffe48 =
         (ktxTexture1 *)testing::AssertionResult::failure_message((AssertionResult *)0x1318d2);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffffe40,type,(char *)in_stack_fffffffffffffe30,iVar4,
               in_stack_fffffffffffffe20);
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffffe90,(Message *)in_stack_fffffffffffffe88);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffe10);
    testing::Message::~Message((Message *)0x13192f);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x13199d);
  local_81 = local_10[0] != 0;
  testing::AssertionResult::AssertionResult<bool>
            (in_stack_fffffffffffffe10,(bool *)in_stack_fffffffffffffe08,(type *)0x1319cb);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_80);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffe40);
    in_stack_fffffffffffffe40 =
         (AssertHelper *)
         testing::Message::operator<<
                   ((Message *)in_stack_fffffffffffffe10,in_stack_fffffffffffffe08);
    uVar2 = ktxErrorString(local_14);
    local_98 = uVar2;
    in_stack_fffffffffffffe30 =
         testing::Message::operator<<
                   ((Message *)in_stack_fffffffffffffe10,(char **)in_stack_fffffffffffffe08);
    type = (Type)((ulong)uVar2 >> 0x20);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)in_stack_fffffffffffffe88,(char *)in_stack_fffffffffffffe80,
               (char *)in_stack_fffffffffffffe78._M_head_impl,in_stack_fffffffffffffe70);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffffe40,type,(char *)in_stack_fffffffffffffe30,iVar4,
               in_stack_fffffffffffffe20);
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffffe90,(Message *)in_stack_fffffffffffffe88);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffe10);
    std::__cxx11::string::~string(local_c0);
    testing::Message::~Message((Message *)0x131aef);
  }
  local_c4 = (uint)!bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x131b9c);
  if (local_c4 == 0) {
    snprintf(local_32,10,"S=%c,T=%c",0x72,100);
    lhs_expression = (char *)(local_10[0] + 0x50);
    sVar3 = strlen(local_32);
    ktxHashList_AddKVPair(lhs_expression,"KTXorientation",(int)sVar3 + 1,local_32);
    local_14 = TextureWriterTestHelper<unsigned_char,_4U,_32856U>::copyImagesToTexture
                         (in_RDI,in_stack_fffffffffffffe48);
    local_d9 = local_14 == KTX_SUCCESS;
    testing::AssertionResult::AssertionResult<bool>
              (in_stack_fffffffffffffe10,(bool *)in_stack_fffffffffffffe08,(type *)0x131c5a);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_d8);
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_fffffffffffffe40);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((AssertionResult *)in_stack_fffffffffffffe88,(char *)in_stack_fffffffffffffe80,
                 (char *)in_stack_fffffffffffffe78._M_head_impl,in_stack_fffffffffffffe70);
      std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (in_stack_fffffffffffffe40,type,(char *)in_stack_fffffffffffffe30,
                 (int)((ulong)lhs_expression >> 0x20),in_stack_fffffffffffffe20);
      testing::internal::AssertHelper::operator=
                (in_stack_fffffffffffffe90,(Message *)in_stack_fffffffffffffe88);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffe10);
      std::__cxx11::string::~string(local_110);
      testing::Message::~Message((Message *)0x131d2d);
    }
    local_c4 = (uint)!bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x131dda);
    if (local_c4 == 0) {
      local_121 = TextureWriterTestHelper<unsigned_char,_4U,_32856U>::compareTexture1Images
                            (in_stack_fffffffffffffe88,in_stack_fffffffffffffe80);
      local_122 = 1;
      testing::internal::EqHelper::Compare<bool,_bool,_nullptr>
                (lhs_expression,in_stack_fffffffffffffe20,in_stack_fffffffffffffe18,
                 &in_stack_fffffffffffffe10->success_);
      bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_120);
      if (!bVar1) {
        testing::Message::Message((Message *)in_stack_fffffffffffffe40);
        in_stack_fffffffffffffe20 =
             testing::AssertionResult::failure_message((AssertionResult *)0x131e88);
        testing::internal::AssertHelper::AssertHelper
                  (in_stack_fffffffffffffe40,type,(char *)in_stack_fffffffffffffe30,
                   (int)((ulong)lhs_expression >> 0x20),in_stack_fffffffffffffe20);
        testing::internal::AssertHelper::operator=
                  (in_stack_fffffffffffffe90,(Message *)in_stack_fffffffffffffe88);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffe10);
        testing::Message::~Message((Message *)0x131ee5);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x131f53);
      ktxTexture1_WriteToMemory(local_10[0],&local_20,local_28);
      testing::internal::EqHelper::Compare<ktx_error_code_e,_ktx_error_code_e,_nullptr>
                (lhs_expression,in_stack_fffffffffffffe20,
                 (ktx_error_code_e *)in_stack_fffffffffffffe18,
                 (ktx_error_code_e *)in_stack_fffffffffffffe10);
      bVar1 = testing::AssertionResult::operator_cast_to_bool(local_148);
      if (!bVar1) {
        testing::Message::Message((Message *)in_stack_fffffffffffffe40);
        in_stack_fffffffffffffe18 =
             (bool *)testing::AssertionResult::failure_message((AssertionResult *)0x131ff3);
        testing::internal::AssertHelper::AssertHelper
                  (in_stack_fffffffffffffe40,type,(char *)in_stack_fffffffffffffe30,
                   (int)((ulong)lhs_expression >> 0x20),in_stack_fffffffffffffe20);
        testing::internal::AssertHelper::operator=
                  (in_stack_fffffffffffffe90,(Message *)in_stack_fffffffffffffe88);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffe10);
        testing::Message::~Message((Message *)0x132050);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x1320be);
      testing::internal::EqHelper::Compare<unsigned_long,_unsigned_long,_nullptr>
                (lhs_expression,in_stack_fffffffffffffe20,(unsigned_long *)in_stack_fffffffffffffe18
                 ,(unsigned_long *)in_stack_fffffffffffffe10);
      bVar1 = testing::AssertionResult::operator_cast_to_bool
                        ((AssertionResult *)&stack0xfffffffffffffe90);
      if (!bVar1) {
        testing::Message::Message((Message *)in_stack_fffffffffffffe40);
        in_stack_fffffffffffffe10 =
             (AssertionResult *)
             testing::AssertionResult::failure_message((AssertionResult *)0x132133);
        testing::internal::AssertHelper::AssertHelper
                  (in_stack_fffffffffffffe40,type,(char *)in_stack_fffffffffffffe30,
                   (int)((ulong)lhs_expression >> 0x20),in_stack_fffffffffffffe20);
        testing::internal::AssertHelper::operator=
                  (in_stack_fffffffffffffe90,(Message *)in_stack_fffffffffffffe88);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffe10);
        testing::Message::~Message((Message *)0x132187);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x1321f2);
      memcmp(local_20,*(void **)(in_RDI[1].super_WriterTestHelper<unsigned_char,_4U,_32856U>.
                                 orientation + 4),
             *(size_t *)
              (in_RDI[1].super_WriterTestHelper<unsigned_char,_4U,_32856U>.orientation + 0xc));
      testing::internal::EqHelper::Compare<int,_int,_nullptr>
                (lhs_expression,in_stack_fffffffffffffe20,(int *)in_stack_fffffffffffffe18,
                 (int *)in_stack_fffffffffffffe10);
      iVar4 = (int)((ulong)lhs_expression >> 0x20);
      bVar1 = testing::AssertionResult::operator_cast_to_bool
                        ((AssertionResult *)&stack0xfffffffffffffe70);
      if (!bVar1) {
        testing::Message::Message((Message *)in_stack_fffffffffffffe40);
        testing::AssertionResult::failure_message((AssertionResult *)0x13227d);
        testing::internal::AssertHelper::AssertHelper
                  (in_stack_fffffffffffffe40,type,(char *)in_stack_fffffffffffffe30,iVar4,
                   in_stack_fffffffffffffe20);
        testing::internal::AssertHelper::operator=
                  (in_stack_fffffffffffffe90,(Message *)in_stack_fffffffffffffe88);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffe10);
        testing::Message::~Message((Message *)0x1322c9);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x13232b);
      if (local_10[0] != 0) {
        ktxTexture1_Destroy(local_10[0]);
      }
    }
  }
  return;
}

Assistant:

TEST_F(ktxTexture1_CreateTest, CreateEmptySetImagesWriteToMemory) {
    ktxTexture1* texture = 0;
    KTX_error_code result;
    ktx_uint8_t* testMemFile;
    ktx_size_t testMemFileLen;
    char orientation[10];

    result = ktxTexture1_Create(&createInfo, KTX_TEXTURE_CREATE_ALLOC_STORAGE,
                                &texture);
    EXPECT_EQ(result, KTX_SUCCESS);
    ASSERT_TRUE(texture != NULL) << "ktxTexture1_Create failed: "
                                 << ktxErrorString(result);

    snprintf(orientation, sizeof(orientation), KTX_ORIENTATION2_FMT,
             'r', 'd');
    ktxHashList_AddKVPair(&texture->kvDataHead, KTX_ORIENTATION_KEY,
                          (unsigned int)strlen(orientation) + 1,
                          orientation);
    result = helper.copyImagesToTexture(texture);
    ASSERT_TRUE(result == KTX_SUCCESS);
    EXPECT_EQ(helper.compareTexture1Images(texture->pData), true);
    EXPECT_EQ(ktxTexture1_WriteToMemory(texture, &testMemFile, &testMemFileLen),
              KTX_SUCCESS);
    EXPECT_EQ(testMemFileLen, ktxMemFileLen);
    EXPECT_EQ(memcmp(testMemFile, ktxMemFile, ktxMemFileLen), 0);

    if (texture)
        ktxTexture1_Destroy(texture);
}